

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptStructBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  TType *pTVar4;
  TArraySizes *this_00;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var_00;
  TType *pTVar5;
  char *syntax;
  ulong uVar6;
  ulong uVar7;
  pool_allocator<char> local_118;
  TString local_110;
  TTypeLoc member;
  TType blockType;
  
  pTVar4 = type;
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar7 = 0;
  bVar1 = true;
  switch(EVar2) {
  case EHTokAppendStructuredBuffer:
  case EHTokConsumeStructuredBuffer:
    uVar6 = 0x4b06;
    break;
  case EHTokByteAddressBuffer:
    uVar6 = 0x4c86;
    uVar7 = 0x800000000000;
    goto LAB_003a95af;
  case EHTokRWByteAddressBuffer:
    uVar6 = 0x4d06;
    uVar7 = 0;
LAB_003a95af:
    bVar1 = false;
    break;
  case EHTokRWStructuredBuffer:
    uVar6 = 0x4b86;
    uVar7 = 0;
    break;
  case EHTokStructuredBuffer:
    uVar6 = 0x4c06;
    uVar7 = 0x800000000000;
    break;
  default:
    goto switchD_003a958a_default;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  pTVar4 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar4);
  TType::TType(pTVar4,EbtVoid,EvqTemporary,1,0,0,false);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      bVar1 = acceptType(this,pTVar4);
      if (bVar1) {
        pTVar5 = (TType *)0x176;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) goto LAB_003a967b;
        syntax = "right angle bracket";
      }
      else {
        syntax = "type";
      }
    }
    else {
      syntax = "left angle bracket";
    }
    expected(this,syntax);
    uVar7 = 0;
  }
  else {
    pTVar5 = &blockType;
    TType::TType(pTVar5,EbtUint,EvqBuffer,1,0,0,false);
    TType::shallowCopy(pTVar4,pTVar5);
LAB_003a967b:
    this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)pTVar5);
    (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
    (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    this_00->implicitArraySize = 0;
    this_00->implicitlySized = true;
    this_00->variablyIndexed = false;
    TArraySizes::addInnerSize(this_00,0);
    pTVar4->arraySizes = this_00;
    iVar3 = (*pTVar4->_vptr_TType[10])(pTVar4);
    *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) & 0xffffffffffffff80 | 6;
    local_110._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    pTVar5 = &blockType;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pTVar5,
               "@data",(pool_allocator<char> *)&local_110);
    (*pTVar4->_vptr_TType[4])(pTVar4);
    this_01 = (vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
              TVector<glslang::TTypeLoc>::operator_new
                        ((TVector<glslang::TTypeLoc> *)0x20,(size_t)pTVar5);
    TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)this_01);
    member.loc.name = (this->super_HlslTokenStream).token.loc.name;
    member.loc.string = (this->super_HlslTokenStream).token.loc.string;
    member.loc.line = (this->super_HlslTokenStream).token.loc.line;
    member.loc.column = (this->super_HlslTokenStream).token.loc.column;
    member.loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    member.type = pTVar4;
    std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
              (this_01,&member);
    local_118.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_110
               ,"",&local_118);
    iVar3 = (*pTVar4->_vptr_TType[10])(pTVar4);
    TType::TType(&blockType,(TTypeList *)this_01,&local_110,
                 (TQualifier *)CONCAT44(extraout_var_00,iVar3));
    blockType.qualifier._8_8_ = uVar6 | uVar7 | blockType.qualifier._8_8_ & 0xffff7fffffff0000;
    HlslParseContext::shareStructBufferType(this->parseContext,&blockType);
    TType::shallowCopy(type,&blockType);
    uVar7 = 1;
  }
switchD_003a958a_default:
  return SUB81(uVar7,0);
}

Assistant:

bool HlslGrammar::acceptStructBufferType(TType& type)
{
    const EHlslTokenClass structBuffType = peek();

    // TODO: globallycoherent
    bool hasTemplateType = true;
    bool readonly = false;

    TStorageQualifier storage = EvqBuffer;
    TBuiltInVariable  builtinType = EbvNone;

    switch (structBuffType) {
    case EHTokAppendStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokByteAddressBuffer:
        hasTemplateType = false;
        readonly = true;
        builtinType = EbvByteAddressBuffer;
        break;
    case EHTokConsumeStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokRWByteAddressBuffer:
        hasTemplateType = false;
        builtinType = EbvRWByteAddressBuffer;
        break;
    case EHTokRWStructuredBuffer:
        builtinType = EbvRWStructuredBuffer;
        break;
    case EHTokStructuredBuffer:
        builtinType = EbvStructuredBuffer;
        readonly = true;
        break;
    default:
        return false;  // not a structure buffer type
    }

    advanceToken();  // consume the structure keyword

    // type on which this StructedBuffer is templatized.  E.g, StructedBuffer<MyStruct> ==> MyStruct
    TType* templateType = new TType;

    if (hasTemplateType) {
        if (! acceptTokenClass(EHTokLeftAngle)) {
            expected("left angle bracket");
            return false;
        }
    
        if (! acceptType(*templateType)) {
            expected("type");
            return false;
        }
        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else {
        // byte address buffers have no explicit type.
        TType uintType(EbtUint, storage);
        templateType->shallowCopy(uintType);
    }

    // Create an unsized array out of that type.
    // TODO: does this work if it's already an array type?
    TArraySizes* unsizedArray = new TArraySizes;
    unsizedArray->addInnerSize(UnsizedArraySize);
    templateType->transferArraySizes(unsizedArray);
    templateType->getQualifier().storage = storage;

    // field name is canonical for all structbuffers
    templateType->setFieldName("@data");

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { templateType, token.loc };
    blockStruct->push_back(member);

    // This is the type of the buffer block (SSBO)
    TType blockType(blockStruct, "", templateType->getQualifier());

    blockType.getQualifier().storage = storage;
    blockType.getQualifier().readonly = readonly;
    blockType.getQualifier().builtIn = builtinType;

    // We may have created an equivalent type before, in which case we should use its
    // deep structure.
    parseContext.shareStructBufferType(blockType);

    type.shallowCopy(blockType);

    return true;
}